

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O2

int experimental_hooks_remove_ctl
              (tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
              size_t newlen)

{
  int iVar1;
  
  if (oldp != (void *)0x0 || oldlenp != (size_t *)0x0) {
    return 1;
  }
  iVar1 = 0x16;
  if ((newlen == 8 && newp != (void *)0x0) && (*newp != (void *)0x0)) {
    duckdb_je_hook_remove((tsdn_t *)tsd,*newp);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int
experimental_hooks_remove_ctl(tsd_t *tsd, const size_t *mib, size_t miblen,
    void *oldp, size_t *oldlenp, void *newp, size_t newlen) {
	int ret;
	WRITEONLY();
	void *handle = NULL;
	WRITE(handle, void *);
	if (handle == NULL) {
		ret = EINVAL;
		goto label_return;
	}
	hook_remove(tsd_tsdn(tsd), handle);
	ret = 0;
label_return:
	return ret;
}